

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

_Bool borg_shoot_scoot_safe(wchar_t emergency,wchar_t turns,wchar_t b_p)

{
  bitflag *flags;
  ushort uVar1;
  borg_grid *pbVar2;
  loc grid;
  loc_conflict grid1;
  bool bVar3;
  monster_race *pmVar4;
  borg_kill *pbVar5;
  int iVar6;
  int iVar7;
  _Bool _Var8;
  uint32_t uVar9;
  uint32_t uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  loc_conflict grid2;
  wchar_t y;
  char *pcVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  wchar_t X;
  ulong uVar17;
  long lVar18;
  
  if ((((borg.trait[0x23] < 8) || (borg.trait[0x69] != 0)) && (borg.trait[0xd2] != 0)) &&
     ((borg.trait[0x1a] != 0 &&
      (grid.y = borg.c.y, grid.x = borg.c.x, _Var8 = square_isvault(cave,grid), !_Var8)))) {
    _Var8 = borg_primarily_caster();
    if (_Var8) {
      if (borg.trait[0x23] < 0x2d) {
        if (4 < borg.trait[0x1e]) goto LAB_0021be46;
      }
      else if (0xe < borg.trait[0x1e]) {
LAB_0021be46:
        if ((borg_morgoth_position == false) && (borg_as_position == false)) {
          lVar18 = 0;
          bVar3 = false;
          do {
            pbVar5 = borg_kills;
            pmVar4 = r_info;
            uVar16 = (ulong)borg_grids[(long)ddy_ddd[lVar18] + (long)borg.c.y]
                            [(long)ddx_ddd[lVar18] + (long)borg.c.x].kill;
            if (uVar16 != 0) {
              if (borg_kills[uVar16].awake == true) {
                uVar1 = borg_kills[uVar16].r_idx;
                flags = r_info[uVar1].flags;
                _Var8 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
                if ((((!_Var8) &&
                     (_Var8 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL"), !_Var8))
                    && (_Var8 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL"), !_Var8))
                   && (borg.trait[0x23] <= (int)pbVar5[uVar16].power)) {
                  _Var8 = borg_spell_okay(MAGIC_MISSILE);
                  if (((_Var8) || (_Var8 = borg_spell_okay(ORB_OF_DRAINING), _Var8)) ||
                     (_Var8 = borg_spell_okay(NETHER_BOLT), _Var8)) {
                    bVar3 = true;
                  }
                  else {
                    wVar11 = borg_danger_one_kill
                                       (pbVar5[uVar16].pos.y,pbVar5[uVar16].pos.x,L'\x01',
                                        (wchar_t)lVar18,true,false);
                    if ((((avoidance * 3) / 10 < wVar11) ||
                        ((((pmVar4[uVar1].friends != (monster_friends *)0x0 ||
                           (pmVar4[uVar1].friends_base != (monster_friends_base *)0x0)) &&
                          (borg.trait[0x23] + -5 <= (int)pbVar5[uVar16].level)) ||
                         (((pbVar5[uVar16].ranged_attack != '\0' ||
                           (_Var8 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), _Var8)) ||
                          (_Var8 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY"), _Var8)
                          ))))) || (borg.trait[0x23] < 6)) {
                      bVar3 = true;
                    }
                  }
                }
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 8);
          wVar12 = L'\0';
          wVar11 = wVar12;
          if (bVar3) {
            iVar14 = 0;
LAB_0021c0d3:
            iVar15 = 0;
LAB_0021c0e4:
            do {
              iVar7 = borg.c.y;
              lVar18 = (long)borg.c.y;
              uVar9 = Rand_div(0x15);
              iVar6 = borg.c.x;
              uVar16 = ((int)uVar9 + lVar18) - 10;
              lVar18 = (long)borg.c.x;
              uVar10 = Rand_div(0x15);
              uVar17 = (lVar18 + (int)uVar10) - 10;
              X = (wchar_t)uVar17;
              y = (wchar_t)uVar16;
              grid2 = loc(X,y);
              grid1.y = borg.c.y;
              grid1.x = borg.c.x;
              wVar11 = distance(grid1,grid2);
            } while (5 < (uint)(wVar11 + L'\xfffffffb'));
            if (((uVar9 + iVar7) - 0x4a < 0xffffffc1) || ((uVar10 + iVar6) - 0xce < 0xffffff3d))
            goto LAB_0021c19b;
            pbVar2 = borg_grids[uVar16 & 0xffffffff];
            if ((pbVar2[uVar17 & 0xffffffff].feat == '\0') ||
               ((_Var8 = borg_cave_floor_bold(y,X), !_Var8 ||
                (pbVar2[uVar17 & 0xffffffff].kill != '\0')))) goto LAB_0021c19b;
            wVar11 = borg_danger(y,X,turns,true,false);
            if (wVar11 <= b_p) {
              lVar18 = 0;
              do {
                if ((ulong)borg_grids[(long)ddy_ddd[lVar18] + uVar16]
                           [(long)ddx_ddd[lVar18] + uVar17].kill != 0) {
                  wVar12 = wVar12 + (uint)borg_kills
                                          [borg_grids[(long)ddy_ddd[lVar18] + uVar16]
                                           [(long)ddx_ddd[lVar18] + uVar17].kill].awake;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 != 8);
              goto LAB_0021c1b3;
            }
            goto LAB_0021c1a8;
          }
          goto LAB_0021bdfe;
        }
      }
    }
    else if ((4 < borg.trait[0x9b]) && (borg.trait[0x23] < 0x2d)) goto LAB_0021be46;
  }
  wVar11 = L'\0';
LAB_0021bdfe:
  return SUB41(wVar11,0);
LAB_0021c19b:
  iVar15 = iVar15 + 1;
  if (iVar15 == 100) goto LAB_0021c1a8;
  goto LAB_0021c0e4;
LAB_0021c1a8:
  wVar12 = wVar12 + L'\x01';
LAB_0021c1b3:
  iVar14 = iVar14 + 1;
  if (iVar14 == 100) goto LAB_0021c24b;
  goto LAB_0021c0d3;
LAB_0021c24b:
  wVar11 = (wchar_t)(wVar12 <= emergency);
  pcVar13 = "# No Shoot\'N\'Scoot. scary squares: %d/100";
  if (wVar12 <= emergency) {
    pcVar13 = "# Safe to Shoot\'N\'Scoot. scary squares: %d/100";
  }
  pcVar13 = format(pcVar13,(ulong)(uint)wVar12);
  borg_note(pcVar13);
  goto LAB_0021bdfe;
}

Assistant:

bool borg_shoot_scoot_safe(int emergency, int turns, int b_p)
{
    int n, k, i, d, x, y, p, u;

    int dis               = 10;

    int min               = dis / 2;

    bool adjacent_monster = false;

    borg_grid           *ag;
    borg_kill           *kill;
    struct monster_race *r_ptr;

    /* no need if high level in town */
    if (borg.trait[BI_CLEVEL] >= 8 && borg.trait[BI_CDEPTH] == 0)
        return false;

    /* must have the ability */
    if (!borg.trait[BI_APHASE])
        return false;

    /* Not if No Light */
    if (!borg.trait[BI_LIGHT])
        return false;

    /* Cheat the floor grid */
    /* Not if in a vault since it throws us out of the vault */
    if (square_isvault(cave, borg.c))
        return false;

    /*** Need Missiles or cheap spells ***/

    /* classes that are mainly spellcaster */
    if (borg_primarily_caster()) {
        /* Low mana */
        if (borg.trait[BI_CLEVEL] >= 45 && borg.trait[BI_CURSP] < 15)
            return false;

        /* Low mana, low level, generally OK */
        if (borg.trait[BI_CLEVEL] < 45 && borg.trait[BI_CURSP] < 5)
            return false;
    } else /* Other classes need some missiles */
    {
        if (borg.trait[BI_AMISSILES] < 5 || borg.trait[BI_CLEVEL] >= 45)
            return false;
    }

    /* Not if I am in a safe spot for killing special monsters */
    if (borg_morgoth_position || borg_as_position)
        return false;

    /* scan the adjacent grids for an awake monster */
    for (i = 0; i < 8; i++) {
        /* Grid in that direction */
        x = borg.c.x + ddx_ddd[i];
        y = borg.c.y + ddy_ddd[i];

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Obtain the monster */
        kill  = &borg_kills[ag->kill];
        r_ptr = &r_info[kill->r_idx];

        /* If a qualifying monster is adjacent to me. */
        if ((ag->kill && kill->awake) && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))
            && !(rf_has(r_ptr->flags, RF_PASS_WALL))
            && !(rf_has(r_ptr->flags, RF_KILL_WALL))
            && (kill->power >= borg.trait[BI_CLEVEL])) {
            /* Spell casters shoot at everything */
            if (borg_spell_okay(MAGIC_MISSILE)) {
                adjacent_monster = true;
            } else if (borg_spell_okay(ORB_OF_DRAINING)) {
                adjacent_monster = true;
            } else if (borg_spell_okay(NETHER_BOLT)) {
                adjacent_monster = true;
            }

            /* All other borgs need to make sure he would shoot.
             * In an effort to conserve missiles, the borg will
             * not shoot at certain types of monsters.  That list
             * is defined in borg_launch_damage_one().
             *
             * We need this aforementioned list to match the one
             * following.  Otherwise Rogues and Warriors will
             * burn up Phases as he scoots away but never fire
             * the missiles.  That totally defeats the purpose
             * of this routine.
             *
             * The following criteria are exactly the same as the
             * list in borg_launch_damage_one()
             */
            else if ((borg_danger_one_kill(
                          kill->pos.y, kill->pos.x, 1, i, true, false)
                         > avoidance * 3 / 10)
                     || ((r_ptr->friends
                             || r_ptr->friends_base) /* monster has friends*/
                         && kill->level
                                >= borg.trait[BI_CLEVEL] - 5 /* close levels */)
                     || (kill->ranged_attack /* monster has a ranged attack */)
                     || (rf_has(r_ptr->flags, RF_UNIQUE))
                     || (rf_has(r_ptr->flags, RF_MULTIPLY))
                     || (borg.trait[BI_CLEVEL] <= 5 /* still very weak */)) {
                adjacent_monster = true;
            }
        }
    }

    /* if No Adjacent_monster no need for it */
    if (adjacent_monster == false)
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 2))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 2))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids */
            if (ag->feat == FEAT_NONE)
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Stop looking.  Really, the game would keep
             * looking for a grid.  The borg could check
             * all the known grids but I don't think that
             * is not a good idea, especially if the area is
             * not fully explored.
             */
            break;
        }

        /* No location */
        /* In the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but we define it as dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine danger of that grid */
        p = borg_danger(y, x, turns, true, false);

        /* if more scary than my current one, do not allow jumps at all */
        if (p > b_p) {
            n++;
            continue;
        }

        /* Should not land next to a monster either.
         * Scan the adjacent grids for a monster.
         * Reuse the adjacent_monster variable.
         */
        for (u = 0; u < 8; u++) {
            /* Access the grid */
            ag = &borg_grids[y + ddy_ddd[u]][x + ddx_ddd[u]];

            /* Obtain the monster */
            kill = &borg_kills[ag->kill];

            /* If monster adjacent to that grid...
             */
            if (ag->kill && kill->awake)
                n++;
        }
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Shoot'N'Scoot. scary squares: %d/100", n));
        return false;
    } else
        borg_note(format("# Safe to Shoot'N'Scoot. scary squares: %d/100", n));

    /* Okay */
    return true;
}